

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::passwordFile(Config *this,string *parameter)

{
  bool bVar1;
  Pipeline *pPVar2;
  undefined1 in_CL;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  bool local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node._M_size = 0;
  local_38._M_impl._M_node.super__List_node_base._M_prev =
       local_38._M_impl._M_node.super__List_node_base._M_next;
  bVar1 = std::operator==(parameter,"-");
  if (bVar1) {
    QUtil::read_lines_from_file_abi_cxx11_
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_50,(QUtil *)&std::cin,(istream *)0x0,(bool)in_CL);
  }
  else {
    QUtil::read_lines_from_file_abi_cxx11_
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_50,(QUtil *)(parameter->_M_dataplus)._M_p,(char *)0x0,(bool)in_CL);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_38,&local_50);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_50);
  if (local_38._M_impl._M_node._M_size != 0) {
    QUtil::make_shared_cstr
              ((QUtil *)&local_50,
               (string *)(local_38._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_50._M_impl._M_node.super__List_node_base._M_prev);
    if (1 < local_38._M_impl._M_node._M_size) {
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)&local_50,local_20);
      pPVar2 = Pipeline::operator<<
                         ((Pipeline *)local_50._M_impl._M_node.super__List_node_base._M_next,
                          &((this->o->m).
                            super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->message_prefix);
      pPVar2 = Pipeline::operator<<(pPVar2,": WARNING: all but the first line of");
      Pipeline::operator<<(pPVar2," the password file are ignored\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_50._M_impl._M_node.super__List_node_base._M_prev);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_38);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::passwordFile(std::string const& parameter)
{
    std::list<std::string> lines;
    if (parameter == "-") {
        QTC::TC("qpdf", "QPDFJob_config password stdin");
        lines = QUtil::read_lines_from_file(std::cin);
    } else {
        QTC::TC("qpdf", "QPDFJob_config password file");
        lines = QUtil::read_lines_from_file(parameter.c_str());
    }
    if (lines.size() >= 1) {
        o.m->password = QUtil::make_shared_cstr(lines.front());

        if (lines.size() > 1) {
            *QPDFLogger::defaultLogger()->getError()
                << this->o.m->message_prefix << ": WARNING: all but the first line of"
                << " the password file are ignored\n";
        }
    }
    return this;
}